

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O3

string * __thiscall
RigidBodyDynamics::Utils::GetModelDOFOverview_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model)

{
  int iVar1;
  string *psVar2;
  ostream *poVar3;
  uint uVar4;
  long lVar5;
  Model *pMVar6;
  SpatialVector *joint_dof;
  SpatialVector *joint_dof_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  stringstream result;
  string local_210;
  Model *local_1f0;
  string local_1e8;
  string *local_1c8;
  ulong local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_210,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (1 < (ulong)((*(long *)(this + 0x340) - *(long *)(this + 0x338) >> 4) * 0x6db6db6db6db6db7)) {
    local_1f0 = (Model *)0x1;
    uVar7 = 0;
    do {
      pMVar6 = local_1f0;
      iVar1 = *(int *)(*(long *)(this + 0xa0) + 0xc + (long)local_1f0 * 0x18);
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          lVar8 = *(long *)(local_1a8[0] + -0x18);
          lVar5 = lVar8;
          if (acStack_c8[lVar8 + 1] == '\0') {
            std::ios::widen((char)local_1a8 + (char)lVar8);
            acStack_c8[lVar8 + 1] = '\x01';
          }
          uVar4 = (uint)lVar5;
          acStack_c8[lVar8] = ' ';
          *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
          get_body_name_abi_cxx11_(&local_210,this,local_1f0,uVar4);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_210._M_dataplus._M_p,local_210._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
          get_dof_name_abi_cxx11_
                    (&local_1e8,(Utils *)((long)pMVar6 * 0x30 + *(long *)(this + 0xb8)),joint_dof);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        else {
          lVar8 = 0;
          uVar9 = 0;
          local_1c0 = uVar7;
          do {
            lVar5 = *(long *)(local_1a8[0] + -0x18);
            if (acStack_c8[lVar5 + 1] == '\0') {
              std::ios::widen((char)local_1a8 + (char)lVar5);
              acStack_c8[lVar5 + 1] = '\x01';
            }
            uVar4 = (int)uVar9 + (int)uVar7;
            acStack_c8[lVar5] = ' ';
            *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
            get_body_name_abi_cxx11_(&local_210,this,local_1f0,uVar4);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,local_210._M_dataplus._M_p,local_210._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
            get_dof_name_abi_cxx11_
                      (&local_1e8,
                       (Utils *)(*(long *)(*(long *)(this + 0xa0) + (long)pMVar6 * 0x18) + lVar8),
                       joint_dof_00);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            uVar9 = uVar9 + 1;
            lVar8 = lVar8 + 0x30;
          } while (uVar9 < *(uint *)(*(long *)(this + 0xa0) + 0xc + (long)pMVar6 * 0x18));
          uVar7 = (ulong)(uint)((int)local_1c0 + (int)uVar9);
        }
      }
      local_1f0 = (Model *)(ulong)((int)local_1f0 + 1);
      pMVar6 = (Model *)((*(long *)(this + 0x340) - *(long *)(this + 0x338) >> 4) *
                        0x6db6db6db6db6db7);
    } while (local_1f0 <= pMVar6 && (long)pMVar6 - (long)local_1f0 != 0);
  }
  psVar2 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

RBDL_DLLAPI std::string GetModelDOFOverview (const Model &model) {
  stringstream result ("");

  unsigned int q_index = 0;
  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (model.mJoints[i].mDoFCount == 1) {
      result << setfill(' ') << setw(3) << q_index << ": " << get_body_name(model,
             i) << "_" << get_dof_name (model.S[i]) << endl;
      q_index++;
    } else {
      for (unsigned int j = 0; j < model.mJoints[i].mDoFCount; j++) {
        result << setfill(' ') << setw(3) << q_index << ": " << get_body_name(model,
               i) << "_" << get_dof_name (model.mJoints[i].mJointAxes[j]) << endl;
        q_index++;
      }
    }
  }

  return result.str();
}